

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O3

int libcmsockets_LTX_self_check
              (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
              attr_list attrs)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  int int_port_num;
  int host_addr;
  char *host_name;
  char my_host_name [256];
  
  pvVar2 = trans->trans_data;
  get_IP_config(my_host_name,8,&libcmsockets_LTX_self_check::IP,(int *)0x0,(int *)0x0,(int *)0x0,
                (attr_list)0x0,svc->trace_out,cm);
  if (libcmsockets_LTX_self_check::IP == 0) {
    libcmsockets_LTX_self_check::IP = 0x7f000001;
  }
  iVar3 = query_attr(attrs,CM_IP_HOSTNAME,0,&host_name);
  if (iVar3 == 0) {
    (*svc->trace_out)(cm,"CMself check TCP/IP transport found no IP_HOST attribute");
    host_name = (char *)0x0;
  }
  iVar3 = query_attr(attrs,CM_IP_ADDR,0,&host_addr);
  if (iVar3 == 0) {
    (*svc->trace_out)(cm,"CMself check TCP/IP transport found no IP_ADDR attribute");
    if (host_name == (char *)0x0) {
      return 0;
    }
    host_addr = 0;
  }
  iVar3 = query_attr(attrs,CM_IP_PORT,0,&int_port_num);
  if (iVar3 == 0) {
    pcVar6 = "CMself check TCP/IP transport found no IP_PORT attribute";
  }
  else {
    if ((host_name == (char *)0x0) || (iVar3 = strcmp(host_name,my_host_name), iVar3 == 0)) {
      uVar5 = (ulong)(uint)host_addr;
      if ((host_addr == 0) || (libcmsockets_LTX_self_check::IP == host_addr)) {
        lVar4 = (long)*(int *)((long)pvVar2 + 0x10);
        if (0 < lVar4) {
          lVar7 = 0;
          iVar3 = 0;
          do {
            iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x20) + lVar7 * 4);
            if (int_port_num == iVar1) {
              iVar3 = iVar1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar4 != lVar7);
          if (iVar3 != 0) {
            (*svc->trace_out)(cm,"CMself check returning TRUE");
            return 1;
          }
        }
        pcVar6 = "CMself check - Ports don\'t match, %d, %d";
        uVar5 = 0;
      }
      else {
        pcVar6 = "CMself check - Host IP addrs don\'t match, %lx, %lx";
        int_port_num = libcmsockets_LTX_self_check::IP;
      }
      (*svc->trace_out)(cm,pcVar6,(ulong)(uint)int_port_num,uVar5);
      return 0;
    }
    pcVar6 = "CMself check - Hostnames don\'t match";
  }
  (*svc->trace_out)(cm,pcVar6);
  return 0;
}

Assistant:

extern int
libcmsockets_LTX_self_check(CManager cm, CMtrans_services svc, transport_entry trans, attr_list attrs)
{

    socket_client_data_ptr sd = trans->trans_data;
    int host_addr;
    int int_port_num;
    char *host_name;
    char my_host_name[256];
    static int IP = 0;

    get_IP_config(my_host_name, sizeof(host_name), &IP, NULL, NULL, NULL,
		  NULL, svc->trace_out, (void *)cm);

    if (IP == 0) {
	if (IP == 0) IP = INADDR_LOOPBACK;
    }
    if (!query_attr(attrs, CM_IP_HOSTNAME, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & host_name)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_HOST attribute");
	host_name = NULL;
    }
    if (!query_attr(attrs, CM_IP_ADDR, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & host_addr)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_ADDR attribute");
	if (host_name == NULL) return 0;
	host_addr = 0;
    }
    if (!query_attr(attrs, CM_IP_PORT, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & int_port_num)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_PORT attribute");
	return 0;
    }
    if (host_name && (strcmp(host_name, my_host_name) != 0)) {
	svc->trace_out(cm, "CMself check - Hostnames don't match");
	return 0;
    }
    if (host_addr && (IP != host_addr)) {
	svc->trace_out(cm, "CMself check - Host IP addrs don't match, %lx, %lx", IP, host_addr);
	return 0;
    }
    int port_match = 0;
    for (int i = 0; i < sd->listen_count; i++) {
	if (int_port_num == sd->listen_ports[i]) {
	    port_match = sd->listen_ports[i];
	}
    }
    if (!port_match) {
	svc->trace_out(cm, "CMself check - Ports don't match, %d, %d", int_port_num, port_match);
	return 0;
    }
    svc->trace_out(cm, "CMself check returning TRUE");
    return 1;
}